

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowDemoWindowTables::MyTreeNode::DisplayNode(MyTreeNode *node,MyTreeNode *all_nodes)

{
  bool bVar1;
  int local_20;
  int child_n;
  bool open;
  bool is_folder;
  MyTreeNode *all_nodes_local;
  MyTreeNode *node_local;
  
  ImGui::TableNextRow(0,0.0);
  ImGui::TableNextColumn();
  if (node->ChildCount < 1) {
    ImGui::TreeNodeEx(node->Name,0x1308);
    ImGui::TableNextColumn();
    ImGui::Text("%d",(ulong)(uint)node->Size);
    ImGui::TableNextColumn();
    ImGui::TextUnformatted(node->Type,(char *)0x0);
  }
  else {
    bVar1 = ImGui::TreeNodeEx(node->Name,0x1000);
    ImGui::TableNextColumn();
    ImGui::TextDisabled("--");
    ImGui::TableNextColumn();
    ImGui::TextUnformatted(node->Type,(char *)0x0);
    if (bVar1) {
      for (local_20 = 0; local_20 < node->ChildCount; local_20 = local_20 + 1) {
        DisplayNode(all_nodes + (node->ChildIdx + local_20),all_nodes);
      }
      ImGui::TreePop();
    }
  }
  return;
}

Assistant:

static void DisplayNode(const MyTreeNode* node, const MyTreeNode* all_nodes)
                {
                    ImGui::TableNextRow();
                    ImGui::TableNextColumn();
                    const bool is_folder = (node->ChildCount > 0);
                    if (is_folder)
                    {
                        bool open = ImGui::TreeNodeEx(node->Name, ImGuiTreeNodeFlags_SpanFullWidth);
                        ImGui::TableNextColumn();
                        ImGui::TextDisabled("--");
                        ImGui::TableNextColumn();
                        ImGui::TextUnformatted(node->Type);
                        if (open)
                        {
                            for (int child_n = 0; child_n < node->ChildCount; child_n++)
                                DisplayNode(&all_nodes[node->ChildIdx + child_n], all_nodes);
                            ImGui::TreePop();
                        }
                    }
                    else
                    {
                        ImGui::TreeNodeEx(node->Name, ImGuiTreeNodeFlags_Leaf | ImGuiTreeNodeFlags_Bullet | ImGuiTreeNodeFlags_NoTreePushOnOpen | ImGuiTreeNodeFlags_SpanFullWidth);
                        ImGui::TableNextColumn();
                        ImGui::Text("%d", node->Size);
                        ImGui::TableNextColumn();
                        ImGui::TextUnformatted(node->Type);
                    }
                }